

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ExpressionResultBuilder * __thiscall
Catch::ExpressionLhs<int_const&>::captureExpression<(Catch::Internal::Operator)0,int>
          (ExpressionLhs<int_const&> *this,int *rhs)

{
  int iVar1;
  undefined4 uVar2;
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  undefined1 *local_1b8;
  undefined1 local_1a8 [16];
  undefined1 *local_198 [2];
  undefined1 local_188 [96];
  ios_base local_128 [264];
  
  uVar2 = 0x11;
  if (**(int **)(this + 0x228) == *rhs) {
    uVar2 = 0;
  }
  *(undefined4 *)(this + 0x40) = uVar2;
  iVar1 = **(int **)(this + 0x228);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::ostream::operator<<((ostringstream *)local_198,iVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  std::__cxx11::string::_M_assign((string *)(this + 0x50));
  iVar1 = *rhs;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::ostream::operator<<(local_198,iVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  std::__cxx11::string::_M_assign((string *)(this + 0x70));
  local_198[0] = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"==","");
  std::__cxx11::string::_M_assign((string *)(this + 0x90));
  if (local_198[0] != local_188) {
    operator_delete(local_198[0]);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  return (ExpressionResultBuilder *)this;
}

Assistant:

ExpressionResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_result
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }